

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_file_opener.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>,_true>
duckdb::FileOpener::TryGetCatalogTransaction(optional_ptr<duckdb::FileOpener,_true> opener)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar2;
  FileOpener *in_RSI;
  unique_ptr<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_> in_RDI;
  optional_ptr<duckdb::DatabaseInstance,_true> db;
  optional_ptr<duckdb::ClientContext,_true> context;
  optional_ptr<duckdb::FileOpener,_true> local_50;
  optional_ptr<duckdb::DatabaseInstance,_true> local_48;
  optional_ptr<duckdb::ClientContext,_true> local_40;
  CatalogTransaction local_38;
  
  if (in_RSI == (FileOpener *)0x0) {
LAB_00fb1a93:
    *(undefined8 *)
     in_RDI._M_t.
     super___uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::CatalogTransaction_*,_std::default_delete<duckdb::CatalogTransaction>_>
     .super__Head_base<0UL,_duckdb::CatalogTransaction_*,_false>._M_head_impl = 0;
  }
  else {
    local_50.ptr = in_RSI;
    optional_ptr<duckdb::FileOpener,_true>::CheckValid(&local_50);
    iVar1 = (*(local_50.ptr)->_vptr_FileOpener[4])();
    local_40.ptr = (ClientContext *)CONCAT44(extraout_var,iVar1);
    if (local_40.ptr == (ClientContext *)0x0) {
      optional_ptr<duckdb::FileOpener,_true>::CheckValid(&local_50);
      iVar1 = (*(local_50.ptr)->_vptr_FileOpener[5])();
      local_48.ptr = (DatabaseInstance *)CONCAT44(extraout_var_00,iVar1);
      if (local_48.ptr == (DatabaseInstance *)0x0) goto LAB_00fb1a93;
      optional_ptr<duckdb::DatabaseInstance,_true>::CheckValid(&local_48);
      CatalogTransaction::GetSystemTransaction(&local_38,local_48.ptr);
    }
    else {
      optional_ptr<duckdb::ClientContext,_true>::CheckValid(&local_40);
      CatalogTransaction::GetSystemCatalogTransaction(&local_38,local_40.ptr);
    }
    puVar2 = (undefined8 *)operator_new(0x28);
    *puVar2 = local_38.db.ptr;
    puVar2[1] = local_38.context.ptr;
    puVar2[2] = local_38.transaction.ptr;
    puVar2[3] = local_38.transaction_id;
    puVar2[4] = local_38.start_time;
    *(undefined8 **)
     in_RDI._M_t.
     super___uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::CatalogTransaction_*,_std::default_delete<duckdb::CatalogTransaction>_>
     .super__Head_base<0UL,_duckdb::CatalogTransaction_*,_false>._M_head_impl = puVar2;
  }
  return (unique_ptr<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>)
         (__uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CatalogTransaction_*,_std::default_delete<duckdb::CatalogTransaction>_>
           .super__Head_base<0UL,_duckdb::CatalogTransaction_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CatalogTransaction> FileOpener::TryGetCatalogTransaction(optional_ptr<FileOpener> opener) {
	if (!opener) {
		return nullptr;
	}
	auto context = opener->TryGetClientContext();
	if (context) {
		return make_uniq<CatalogTransaction>(CatalogTransaction::GetSystemCatalogTransaction(*context));
	}

	auto db = opener->TryGetDatabase();
	if (db) {
		return make_uniq<CatalogTransaction>(CatalogTransaction::GetSystemTransaction(*db));
	}
	return nullptr;
}